

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

VarValue *
deqp::gles31::Functional::getSamplerFillValue(VarValue *__return_storage_ptr__,VarValue *sampler)

{
  undefined8 uVar1;
  DataType DVar2;
  uint uVar3;
  
  uVar3 = sampler->type - TYPE_SAMPLER_2D;
  DVar2 = TYPE_LAST;
  if (uVar3 < 0x19) {
    DVar2 = *(DataType *)(&DAT_0099bd4c + (ulong)uVar3 * 4);
  }
  __return_storage_ptr__->type = DVar2;
  if ((int)DVar2 < 0x1e) {
    if (DVar2 == TYPE_FLOAT) {
      (__return_storage_ptr__->val).floatV[0] = (sampler->val).floatV[1];
      return __return_storage_ptr__;
    }
    if (DVar2 == TYPE_FLOAT_VEC4) {
LAB_0051e07c:
      uVar1 = *(undefined8 *)((long)&sampler->val + 0xc);
      *(undefined8 *)&__return_storage_ptr__->val = *(undefined8 *)((long)&sampler->val + 4);
      *(undefined8 *)((long)&__return_storage_ptr__->val + 8) = uVar1;
      return __return_storage_ptr__;
    }
  }
  else if ((DVar2 == TYPE_UINT_VEC4) || (DVar2 == TYPE_INT_VEC4)) goto LAB_0051e07c;
  return __return_storage_ptr__;
}

Assistant:

static VarValue getSamplerFillValue (const VarValue& sampler)
{
	DE_ASSERT(glu::isDataTypeSampler(sampler.type));

	VarValue result;
	result.type = getSamplerLookupReturnType(sampler.type);

	switch (result.type)
	{
		case glu::TYPE_FLOAT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.floatV[i] = sampler.val.samplerV.fillColor.floatV[i];
			break;
		case glu::TYPE_UINT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.uintV[i] = sampler.val.samplerV.fillColor.uintV[i];
			break;
		case glu::TYPE_INT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.intV[i] = sampler.val.samplerV.fillColor.intV[i];
			break;
		case glu::TYPE_FLOAT:
			result.val.floatV[0] = sampler.val.samplerV.fillColor.floatV[0];
			break;
		default:
			DE_ASSERT(false);
	}

	return result;
}